

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O2

Am_Wrapper * __thiscall Am_Double_Data::Make_Unique(Am_Double_Data *this)

{
  Am_Double_Data *this_00;
  
  this_00 = this;
  if ((this->super_Am_Wrapper).refs != 1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_00 = (Am_Double_Data *)operator_new(0x18);
    Am_Double_Data(this_00,this->value);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

bool
Am_Double_Data::operator==(const Am_Double_Data &test_value) const
{
  return (this == &test_value) || ((double)test_value == value);
}